

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O1

void signature_destroy(signature s)

{
  set *ppsVar1;
  ulong uVar2;
  
  if (s != (signature)0x0) {
    if (s->count != 0) {
      ppsVar1 = &s[1].map;
      uVar2 = 0;
      do {
        if (*ppsVar1 != (set)0x0) {
          free(*ppsVar1);
        }
        uVar2 = uVar2 + 1;
        ppsVar1 = ppsVar1 + 3;
      } while (uVar2 < s->count);
    }
    set_destroy(s->map);
    free(s);
    return;
  }
  return;
}

Assistant:

void signature_destroy(signature s)
{
	if (s != NULL)
	{
		size_t index;

		for (index = 0; index < s->count; ++index)
		{
			signature_node node = signature_at(s, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(s->map);

		free(s);
	}
}